

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O3

bool __thiscall spvtools::opt::InlinePass::HasNoReturnInLoop(InlinePass *this,Function *func)

{
  IRContext *pIVar1;
  pointer puVar2;
  StructuredCFGAnalysis *pSVar3;
  BasicBlock *pBVar4;
  __uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
  this_00;
  bool bVar5;
  bool bVar6;
  uint32_t uVar7;
  undefined8 in_RAX;
  iterator iVar8;
  FeatureManager *pFVar9;
  pointer puVar10;
  undefined8 uStack_38;
  
  pIVar1 = (this->super_Pass).context_;
  pFVar9 = (pIVar1->feature_mgr_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
           .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
  uStack_38 = in_RAX;
  if (pFVar9 == (FeatureManager *)0x0) {
    IRContext::AnalyzeFeatures(pIVar1);
    pFVar9 = (pIVar1->feature_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
             .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
  }
  bVar5 = EnumSet<spv::Capability>::contains(&pFVar9->capabilities_,Shader);
  if (bVar5) {
    pIVar1 = (this->super_Pass).context_;
    if ((pIVar1->valid_analyses_ & kAnalysisStructuredCFG) == kAnalysisNone) {
      IRContext::BuildStructuredCFGAnalysis(pIVar1);
    }
    puVar10 = (func->blocks_).
              super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (func->blocks_).
             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar5 = true;
    if (puVar10 != puVar2) {
      pSVar3 = (pIVar1->struct_cfg_analysis_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::StructuredCFGAnalysis,_std::default_delete<spvtools::opt::StructuredCFGAnalysis>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::StructuredCFGAnalysis_*,_std::default_delete<spvtools::opt::StructuredCFGAnalysis>_>
               .super__Head_base<0UL,_spvtools::opt::StructuredCFGAnalysis_*,_false>._M_head_impl;
      do {
        pBVar4 = (puVar10->_M_t).
                 super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                 .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
        bVar6 = spvOpcodeIsReturn((*(Instruction **)
                                    ((long)&(pBVar4->insts_).
                                            super_IntrusiveList<spvtools::opt::Instruction> + 0x18))
                                  ->opcode_);
        if (bVar6) {
          this_00.
          super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
               (pBVar4->label_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
          ;
          uVar7 = 0;
          if (*(bool *)((long)this_00.
                              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                              _M_head_impl + 0x2d) == true) {
            uVar7 = Instruction::GetSingleWordOperand
                              ((Instruction *)
                               this_00.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl,
                               (uint)*(bool *)((long)this_00.
                                                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                                                  .
                                                  super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>
                                                  ._M_head_impl + 0x2c));
          }
          uStack_38 = CONCAT44(uVar7,(undefined4)uStack_38);
          iVar8 = std::
                  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::StructuredCFGAnalysis::ConstructInfo>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::StructuredCFGAnalysis::ConstructInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&(pSVar3->bb_to_construct_)._M_h,
                         (key_type_conflict *)((long)&uStack_38 + 4));
          if ((iVar8.
               super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::StructuredCFGAnalysis::ConstructInfo>,_false>
               ._M_cur != (__node_type *)0x0) &&
             (*(int *)((long)iVar8.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::StructuredCFGAnalysis::ConstructInfo>,_false>
                             ._M_cur + 0x10) != 0)) goto LAB_0021f725;
        }
        puVar10 = puVar10 + 1;
      } while (puVar10 != puVar2);
    }
  }
  else {
LAB_0021f725:
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool InlinePass::HasNoReturnInLoop(Function* func) {
  // If control not structured, do not do loop/return analysis
  // TODO: Analyze returns in non-structured control flow
  if (!context()->get_feature_mgr()->HasCapability(spv::Capability::Shader))
    return false;
  const auto structured_analysis = context()->GetStructuredCFGAnalysis();
  // Search for returns in structured construct.
  bool return_in_loop = false;
  for (auto& blk : *func) {
    auto terminal_ii = blk.cend();
    --terminal_ii;
    if (spvOpcodeIsReturn(terminal_ii->opcode()) &&
        structured_analysis->ContainingLoop(blk.id()) != 0) {
      return_in_loop = true;
      break;
    }
  }
  return !return_in_loop;
}